

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigfile.c
# Opt level: O0

int big_block_write(BigBlock *bb,BigBlockPtr *ptr,BigArray *array)

{
  uint uVar1;
  char *pcVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  void *buf;
  FILE *__stream;
  int *piVar6;
  char *pcVar7;
  FILE *pFVar8;
  bool bVar9;
  int local_4cc;
  FILE *local_4c8;
  size_t chunk_size;
  ptrdiff_t abs;
  FILE *fp;
  ptrdiff_t towrite;
  BigArrayIter array_iter;
  BigArrayIter chunk_iter;
  size_t dims [2];
  undefined1 local_260 [8];
  BigArray chunk_array;
  size_t CHUNK_SIZE;
  int felsize;
  int nmemb;
  char *chunkbuf;
  BigArray *array_local;
  BigBlockPtr *ptr_local;
  BigBlock *bb_local;
  
  if (array->size == 0) {
    bb_local._4_4_ = 0;
  }
  else {
    bb->dirty = 1;
    buf = malloc(CHUNK_BYTES);
    if (bb->nmemb == 0) {
      local_4cc = 1;
    }
    else {
      local_4cc = bb->nmemb;
    }
    iVar4 = big_file_dtype_itemsize(bb->dtype);
    iVar4 = iVar4 * local_4cc;
    chunk_array.data = (void *)(CHUNK_BYTES / (ulong)(long)iVar4);
    memset(local_260,0,0x220);
    chunk_iter.dataptr = chunk_array.data;
    if (buf == (void *)0x0) {
      _big_file_raise("not enough memory for chunkbuf of size %d bytes",
                      "/workspace/llm4binary/github/license_c_cmakelists/rainwoodman[P]bigfile/src/bigfile.c"
                      ,0x391,CHUNK_BYTES);
    }
    else {
      big_array_init((BigArray *)local_260,buf,bb->dtype,2,(size_t *)&chunk_iter.dataptr,
                     (ptrdiff_t *)0x0);
      big_array_iter_init((BigArrayIter *)&towrite,array);
      fp = (FILE *)(array->size / (ulong)(long)local_4cc);
      if (bb->size < (long)&fp->_flags + bb->foffset[ptr->fileid] + ptr->roffset) {
        _big_file_raise("Writing beyond the block `%s` at (%d:%td)",
                        "/workspace/llm4binary/github/license_c_cmakelists/rainwoodman[P]bigfile/src/bigfile.c"
                        ,0x39c,bb->basename,(ulong)(uint)ptr->fileid,ptr->roffset * (long)iVar4);
      }
      else {
        do {
          bVar9 = false;
          if (0 < (long)fp) {
            iVar5 = big_block_eof(bb,ptr);
            bVar9 = iVar5 == 0;
          }
          if (!bVar9) {
            free(buf);
            return 0;
          }
          local_4c8 = (FILE *)chunk_array.data;
          if ((void *)(bb->fsize[ptr->fileid] - ptr->roffset) < chunk_array.data) {
            local_4c8 = (FILE *)(bb->fsize[ptr->fileid] - ptr->roffset);
          }
          if (fp < local_4c8) {
            local_4c8 = fp;
          }
          big_array_iter_init((BigArrayIter *)&array_iter.dataptr,(BigArray *)local_260);
          iVar5 = _dtype_convert((BigArrayIter *)&array_iter.dataptr,(BigArrayIter *)&towrite,
                                 (long)local_4c8 * (long)bb->nmemb);
          if (iVar5 != 0) {
            _big_file_raise((char *)0x0,
                            "/workspace/llm4binary/github/license_c_cmakelists/rainwoodman[P]bigfile/src/bigfile.c"
                            ,0x3ad);
            goto LAB_0010683e;
          }
          sysvsum(bb->fchecksum + ptr->fileid,buf,(long)local_4c8 * (long)iVar4);
          __stream = (FILE *)_big_file_open_a_file(bb->basename,ptr->fileid,"r+",1);
          if (__stream == (FILE *)0x0) {
            _big_file_raise((char *)0x0,
                            "/workspace/llm4binary/github/license_c_cmakelists/rainwoodman[P]bigfile/src/bigfile.c"
                            ,0x3b4);
            goto LAB_0010683e;
          }
          iVar5 = fseek(__stream,ptr->roffset * (long)iVar4,0);
          if (iVar5 < 0) {
            pcVar2 = bb->basename;
            uVar1 = ptr->fileid;
            lVar3 = ptr->roffset;
            piVar6 = __errno_location();
            pcVar7 = strerror(*piVar6);
            _big_file_raise("Failed to seek in block `%s\' at (%d:%td) (%s)",
                            "/workspace/llm4binary/github/license_c_cmakelists/rainwoodman[P]bigfile/src/bigfile.c"
                            ,0x3b8,pcVar2,(ulong)uVar1,lVar3 * iVar4,pcVar7);
LAB_0010682c:
            fclose(__stream);
            goto LAB_0010683e;
          }
          pFVar8 = (FILE *)fwrite(buf,(long)iVar4,(size_t)local_4c8,__stream);
          if (local_4c8 != pFVar8) {
            pcVar2 = bb->basename;
            uVar1 = ptr->fileid;
            lVar3 = ptr->roffset;
            piVar6 = __errno_location();
            pcVar7 = strerror(*piVar6);
            _big_file_raise("Failed to write in block `%s\' at (%d:%td) (%s)",
                            "/workspace/llm4binary/github/license_c_cmakelists/rainwoodman[P]bigfile/src/bigfile.c"
                            ,0x3bc,pcVar2,(ulong)uVar1,lVar3 * iVar4,pcVar7);
            goto LAB_0010682c;
          }
          fclose(__stream);
          fp = (FILE *)((long)fp - (long)local_4c8);
          iVar5 = big_block_seek_rel(bb,ptr,(ptrdiff_t)local_4c8);
        } while (iVar5 == 0);
        _big_file_raise((char *)0x0,
                        "/workspace/llm4binary/github/license_c_cmakelists/rainwoodman[P]bigfile/src/bigfile.c"
                        ,0x3c1);
      }
LAB_0010683e:
      free(buf);
    }
    bb_local._4_4_ = -1;
  }
  return bb_local._4_4_;
}

Assistant:

int
big_block_write(BigBlock * bb, BigBlockPtr * ptr, BigArray * array)
{
    if(array->size == 0) return 0;
    /* the file header is modified */
    bb->dirty = 1;
    char * chunkbuf = malloc(CHUNK_BYTES);
    int nmemb = bb->nmemb ? bb->nmemb : 1;
    int felsize = big_file_dtype_itemsize(bb->dtype) * nmemb;
    size_t CHUNK_SIZE = CHUNK_BYTES / felsize;

    BigArray chunk_array = {0};
    size_t dims[2];
    dims[0] = CHUNK_SIZE;
    dims[1] = bb->nmemb;

    BigArrayIter chunk_iter;
    BigArrayIter array_iter;
    ptrdiff_t towrite = 0;
    FILE * fp;

    RAISEIF(chunkbuf == NULL,
            ex_malloc,
            "not enough memory for chunkbuf of size %d bytes", CHUNK_BYTES);

    big_array_init(&chunk_array, chunkbuf, bb->dtype, 2, dims, NULL);
    big_array_iter_init(&array_iter, array);

    towrite = array->size / nmemb;

    ptrdiff_t abs = bb->foffset[ptr->fileid] + ptr->roffset + towrite;
    RAISEIF(abs > bb->size,
                ex_eof,
                "Writing beyond the block `%s` at (%d:%td)",
                bb->basename, ptr->fileid, ptr->roffset * felsize);

    while(towrite > 0 && ! big_block_eof(bb, ptr)) {
        size_t chunk_size = CHUNK_SIZE;
        /* remaining items in the file */
        if(chunk_size > bb->fsize[ptr->fileid] - ptr->roffset) {
            chunk_size = bb->fsize[ptr->fileid] - ptr->roffset;
        }
        /* remaining items to read */
        if(chunk_size > towrite) {
            chunk_size = towrite;
        }
        /* write from the beginning of chunk */
        big_array_iter_init(&chunk_iter, &chunk_array);

        /* now translate the data to format in the file*/
        RAISEIF(0 != _dtype_convert(&chunk_iter, &array_iter, chunk_size * bb->nmemb),
            ex_convert, NULL);

        sysvsum(&bb->fchecksum[ptr->fileid], chunkbuf, chunk_size * felsize);

        fp = _big_file_open_a_file(bb->basename, ptr->fileid, "r+", 1);
        RAISEIF(fp == NULL,
                ex_open,
                NULL);
        RAISEIF(0 > fseek(fp, ptr->roffset * felsize, SEEK_SET),
                ex_seek,
                "Failed to seek in block `%s' at (%d:%td) (%s)", 
                bb->basename, ptr->fileid, ptr->roffset * felsize, strerror(errno));
        RAISEIF(chunk_size != fwrite(chunkbuf, felsize, chunk_size, fp),
                ex_write,
                "Failed to write in block `%s' at (%d:%td) (%s)",
                bb->basename, ptr->fileid, ptr->roffset * felsize, strerror(errno));
        fclose(fp);

        towrite -= chunk_size;
        RAISEIF(0 != big_block_seek_rel(bb, ptr, chunk_size),
                ex_blockseek, NULL);
    }
    free(chunkbuf);
    return 0;
ex_write:
ex_seek:
    fclose(fp);
ex_convert:
ex_open:
ex_blockseek:
ex_eof:
    free(chunkbuf);
ex_malloc:
    return -1;
}